

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_deposit_z_i64_sparc
               (TCGContext_conflict7 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg,uint ofs,uint len)

{
  int iVar1;
  TCGv_i64 a2;
  TCGv_i64 zero;
  uint len_local;
  uint ofs_local;
  TCGv_i64 arg_local;
  TCGv_i64 ret_local;
  TCGContext_conflict7 *tcg_ctx_local;
  
  if (ofs + len == 0x40) {
    tcg_gen_shli_i64_sparc(tcg_ctx,ret,arg,(ulong)ofs);
  }
  else if (ofs == 0) {
    tcg_gen_andi_i64_sparc(tcg_ctx,ret,arg,(1L << ((byte)len & 0x3f)) + -1);
  }
  else if ((((ofs == 0) && (len == 8)) || ((ofs == 8 && (len == 8)))) ||
          ((ofs == 0 && (len == 0x10)))) {
    a2 = tcg_const_i64_sparc(tcg_ctx,0);
    tcg_gen_op5ii_i64(tcg_ctx,INDEX_op_deposit_i64,ret,a2,arg,(ulong)ofs,(ulong)len);
    tcg_temp_free_i64(tcg_ctx,a2);
  }
  else if (len == 8) {
    tcg_gen_ext8u_i64_sparc(tcg_ctx,ret,arg);
    tcg_gen_shli_i64_sparc(tcg_ctx,ret,ret,(ulong)ofs);
  }
  else if (len == 0x10) {
    tcg_gen_ext16u_i64_sparc(tcg_ctx,ret,arg);
    tcg_gen_shli_i64_sparc(tcg_ctx,ret,ret,(ulong)ofs);
  }
  else if (len == 0x20) {
    tcg_gen_ext32u_i64_sparc(tcg_ctx,ret,arg);
    tcg_gen_shli_i64_sparc(tcg_ctx,ret,ret,(ulong)ofs);
  }
  else {
    iVar1 = ofs + len;
    if (iVar1 == 8) {
      tcg_gen_shli_i64_sparc(tcg_ctx,ret,arg,(ulong)ofs);
      tcg_gen_ext8u_i64_sparc(tcg_ctx,ret,ret);
    }
    else if (iVar1 == 0x10) {
      tcg_gen_shli_i64_sparc(tcg_ctx,ret,arg,(ulong)ofs);
      tcg_gen_ext16u_i64_sparc(tcg_ctx,ret,ret);
    }
    else if (iVar1 == 0x20) {
      tcg_gen_shli_i64_sparc(tcg_ctx,ret,arg,(ulong)ofs);
      tcg_gen_ext32u_i64_sparc(tcg_ctx,ret,ret);
    }
    else {
      tcg_gen_andi_i64_sparc(tcg_ctx,ret,arg,(1L << ((byte)len & 0x3f)) + -1);
      tcg_gen_shli_i64_sparc(tcg_ctx,ret,ret,(ulong)ofs);
    }
  }
  return;
}

Assistant:

void tcg_gen_deposit_z_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg,
                           unsigned int ofs, unsigned int len)
{
    tcg_debug_assert(ofs < 64);
    tcg_debug_assert(len > 0);
    tcg_debug_assert(len <= 64);
    tcg_debug_assert(ofs + len <= 64);

    if (ofs + len == 64) {
        tcg_gen_shli_i64(tcg_ctx, ret, arg, ofs);
    } else if (ofs == 0) {
        tcg_gen_andi_i64(tcg_ctx, ret, arg, (1ull << len) - 1);
#if TCG_TARGET_HAS_deposit_i64
    } else if (TCG_TARGET_deposit_i64_valid(ofs, len)) {
        TCGv_i64 zero = tcg_const_i64(tcg_ctx, 0);
        tcg_gen_op5ii_i64(tcg_ctx, INDEX_op_deposit_i64, ret, zero, arg, ofs, len);
        tcg_temp_free_i64(tcg_ctx, zero);
#endif
    } else {
#if TCG_TARGET_REG_BITS == 32
            if (ofs >= 32) {
                tcg_gen_deposit_z_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg),
                                      ofs - 32, len);
                tcg_gen_movi_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), 0);
                return;
            }
            if (ofs + len <= 32) {
                tcg_gen_deposit_z_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg), ofs, len);
                tcg_gen_movi_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), 0);
                return;
            }
#endif
        /* To help two-operand hosts we prefer to zero-extend first,
           which allows ARG to stay live.  */
        switch (len) {
        case 32:
#if TCG_TARGET_HAS_ext32u_i64
                tcg_gen_ext32u_i64(tcg_ctx, ret, arg);
                tcg_gen_shli_i64(tcg_ctx, ret, ret, ofs);
                return;
#endif
            break;
        case 16:
#if TCG_TARGET_HAS_ext16u_i64
                tcg_gen_ext16u_i64(tcg_ctx, ret, arg);
                tcg_gen_shli_i64(tcg_ctx, ret, ret, ofs);
                return;
#endif
            break;
        case 8:
#if TCG_TARGET_HAS_ext8u_i64
                tcg_gen_ext8u_i64(tcg_ctx, ret, arg);
                tcg_gen_shli_i64(tcg_ctx, ret, ret, ofs);
                return;
#endif
            break;
        }
        /* Otherwise prefer zero-extension over AND for code size.  */
        switch (ofs + len) {
        case 32:
#if TCG_TARGET_HAS_ext32u_i64
                tcg_gen_shli_i64(tcg_ctx, ret, arg, ofs);
                tcg_gen_ext32u_i64(tcg_ctx, ret, ret);
                return;
#endif
            break;
        case 16:
#if TCG_TARGET_HAS_ext16u_i64
                tcg_gen_shli_i64(tcg_ctx, ret, arg, ofs);
                tcg_gen_ext16u_i64(tcg_ctx, ret, ret);
                return;
#endif
            break;
        case 8:
#if TCG_TARGET_HAS_ext8u_i64
                tcg_gen_shli_i64(tcg_ctx, ret, arg, ofs);
                tcg_gen_ext8u_i64(tcg_ctx, ret, ret);
                return;
#endif
            break;
        }
        tcg_gen_andi_i64(tcg_ctx, ret, arg, (1ull << len) - 1);
        tcg_gen_shli_i64(tcg_ctx, ret, ret, ofs);
    }
}